

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_4_i32(TCGContext_conflict9 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t bofs,
                 uint32_t cofs,uint32_t oprsz,_Bool write_aofs,
                 _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_i32_conflict9 *fni)

{
  TCGv_i32 arg;
  TCGv_i32 arg_00;
  TCGv_i32 arg_01;
  TCGv_i32 arg_02;
  uint local_4c;
  uint32_t i;
  TCGv_i32 t3;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGv_i32 t0;
  _Bool write_aofs_local;
  uint32_t oprsz_local;
  uint32_t cofs_local;
  uint32_t bofs_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_i32(tcg_ctx);
  arg_00 = tcg_temp_new_i32(tcg_ctx);
  arg_01 = tcg_temp_new_i32(tcg_ctx);
  arg_02 = tcg_temp_new_i32(tcg_ctx);
  for (local_4c = 0; local_4c < oprsz; local_4c = local_4c + 4) {
    tcg_gen_ld_i32(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(aofs + local_4c));
    tcg_gen_ld_i32(tcg_ctx,arg_01,tcg_ctx->cpu_env,(ulong)(bofs + local_4c));
    tcg_gen_ld_i32(tcg_ctx,arg_02,tcg_ctx->cpu_env,(ulong)(cofs + local_4c));
    (*fni)(tcg_ctx,arg,arg_00,arg_01,arg_02);
    tcg_gen_st_i32(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(dofs + local_4c));
    if (write_aofs) {
      tcg_gen_st_i32(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(aofs + local_4c));
    }
  }
  tcg_temp_free_i32(tcg_ctx,arg_02);
  tcg_temp_free_i32(tcg_ctx,arg_01);
  tcg_temp_free_i32(tcg_ctx,arg_00);
  tcg_temp_free_i32(tcg_ctx,arg);
  return;
}

Assistant:

static void expand_4_i32(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t bofs,
                         uint32_t cofs, uint32_t oprsz, bool write_aofs,
                         void (*fni)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
    uint32_t i;

    for (i = 0; i < oprsz; i += 4) {
        tcg_gen_ld_i32(tcg_ctx, t1, tcg_ctx->cpu_env, aofs + i);
        tcg_gen_ld_i32(tcg_ctx, t2, tcg_ctx->cpu_env, bofs + i);
        tcg_gen_ld_i32(tcg_ctx, t3, tcg_ctx->cpu_env, cofs + i);
        fni(tcg_ctx, t0, t1, t2, t3);
        tcg_gen_st_i32(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
        if (write_aofs) {
            tcg_gen_st_i32(tcg_ctx, t1, tcg_ctx->cpu_env, aofs + i);
        }
    }
    tcg_temp_free_i32(tcg_ctx, t3);
    tcg_temp_free_i32(tcg_ctx, t2);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t0);
}